

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cxx
# Opt level: O0

ostream * operator<<(ostream *s,Function *f)

{
  ostream *poVar1;
  double dVar2;
  double d_00;
  Matrix local_538;
  Matrix local_438;
  Matrix local_338;
  Matrix local_238;
  uint local_138;
  int i;
  double local_128;
  double d;
  Matrix m;
  int c;
  int n;
  Function *f_local;
  ostream *s_local;
  
  dVar2 = floor((f->dXMax - f->dXMin) / f->dXStep + 0.5);
  m.sMatrixName.field_2._12_4_ = (undefined4)dVar2;
  dVar2 = floor(f->dXMin / f->dXStep + 0.5);
  m.sMatrixName.field_2._8_4_ = (undefined4)dVar2;
  Matrix::Matrix((Matrix *)&d,m.sMatrixName.field_2._12_4_,2);
  local_128 = f->dXMin;
  Function::unvalidate(f);
  for (local_138 = 0; (int)local_138 < (int)m.sMatrixName.field_2._12_4_; local_138 = local_138 + 1)
  {
    local_128 = (double)(int)m.sMatrixName.field_2._8_4_ * f->dXStep;
    Function::setXInput(f,local_128);
    dVar2 = local_128;
    Matrix::operator[](&local_338,(Matrix *)&d,local_138);
    Matrix::operator[](&local_238,&local_338,0);
    Matrix::operator=(&local_238,dVar2);
    Matrix::~Matrix(&local_238);
    Matrix::~Matrix(&local_338);
    (*(f->super_Physical)._vptr_Physical[0xc])();
    Matrix::operator[](&local_538,(Matrix *)&d,local_138);
    Matrix::operator[](&local_438,&local_538,1);
    Matrix::operator=(&local_438,d_00);
    Matrix::~Matrix(&local_438);
    Matrix::~Matrix(&local_538);
    if ((local_138 & 7) == 0) {
      poVar1 = std::operator<<((ostream *)&std::cout,"\rdisplaying function: ");
      poVar1 = (ostream *)
               std::ostream::operator<<
                         (poVar1,((double)(int)local_138 / (double)(int)m.sMatrixName.field_2._12_4_
                                 ) * 100.0);
      poVar1 = std::operator<<(poVar1,"%         \t");
      std::ostream::operator<<(poVar1,std::flush<char,std::char_traits<char>>);
    }
    m.sMatrixName.field_2._8_4_ = m.sMatrixName.field_2._8_4_ + 1;
  }
  poVar1 = std::operator<<((ostream *)&std::cout,"\rdisplaying function: done.         \t");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = operator<<(s,(Matrix *)&d);
  Matrix::~Matrix((Matrix *)&d);
  return poVar1;
}

Assistant:

ostream& operator<<(ostream& s, Function& f)
{
	// only x input
	int n = int(floor((f.dXMax - f.dXMin)/f.dXStep + 0.5));
	int c = int(floor(f.dXMin/f.dXStep + 0.5));
	Matrix m( n, 2 );
	double d = f.dXMin;
        f.unvalidate();
 	for (int i=0; i<n; ++i, ++c) {
		d = c * f.dXStep;
		f.setXInput(d);
		m[i][0] = d;
		m[i][1] = f.getValue();
		if (!(i&0x7)) cout << "\rdisplaying function: " << double(i) / double(n) * 100.0 << "%         \t" << flush;
	}
	cout << "\rdisplaying function: done.         \t" << endl;
	
	// x and y input
	
	return s << m;
}